

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThread.cpp
# Opt level: O2

void __thiscall sznet::net::EventLoopThread::~EventLoopThread(EventLoopThread *this)

{
  this->m_exiting = true;
  if (this->m_loop != (EventLoop *)0x0) {
    EventLoop::quit(this->m_loop);
    Thread::join(&this->m_thread);
  }
  std::_Function_base::~_Function_base(&(this->m_callback).super__Function_base);
  Condition::~Condition(&this->m_cond);
  MutexLock::~MutexLock(&this->m_mutex);
  Thread::~Thread(&this->m_thread);
  return;
}

Assistant:

EventLoopThread::~EventLoopThread()
{
	m_exiting = true;
	if (m_loop != nullptr)
	{
		// 通知完成以后就等
		m_loop->quit();
		m_thread.join();
	}
}